

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrcase.cpp
# Opt level: O0

int32_t ustrcase_internalToTitle_63
                  (int32_t caseLocale,uint32_t options,BreakIterator *iter,UChar *dest,
                  int32_t destCapacity,UChar *src,int32_t srcLength,Edits *edits,
                  UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t iVar2;
  int iVar3;
  bool bVar4;
  UChar *local_90;
  UChar *s;
  char local_7f;
  ushort local_7e;
  uint uStack_7c;
  uint16_t __c2_1;
  UBool toCased;
  int iStack_78;
  uint16_t __c2;
  UChar32 c;
  int32_t titleLimit;
  int32_t titleStart;
  int32_t index;
  int iStack_64;
  UBool isFirstIndex;
  int32_t prev;
  int32_t destIndex;
  UCaseContext csc;
  UChar *src_local;
  int32_t destCapacity_local;
  UChar *dest_local;
  BreakIterator *iter_local;
  uint32_t options_local;
  int32_t caseLocale_local;
  
  csc._24_8_ = src;
  UVar1 = icu_63::ustrcase_checkTitleAdjustmentOptions(options,errorCode);
  if (UVar1 == '\0') {
    options_local = 0;
  }
  else {
    memset(&prev,0,0x20);
    _prev = (void *)csc._24_8_;
    csc.start = srcLength;
    iStack_64 = 0;
    titleStart._3_1_ = '\x01';
    index = 0;
    while (index < srcLength) {
      if (titleStart._3_1_ == '\0') {
        titleLimit = (*(iter->super_UObject)._vptr_UObject[0xd])();
      }
      else {
        titleStart._3_1_ = '\0';
        titleLimit = (*(iter->super_UObject)._vptr_UObject[10])();
      }
      if ((titleLimit == -1) || (srcLength < titleLimit)) {
        titleLimit = srcLength;
      }
      if (index < titleLimit) {
        c = index;
        iStack_78 = index + 1;
        uStack_7c = (uint)*(ushort *)(csc._24_8_ + (long)index * 2);
        if ((((uStack_7c & 0xfffffc00) == 0xd800) && (iStack_78 != titleLimit)) &&
           (local_7e = *(ushort *)(csc._24_8_ + (long)iStack_78 * 2), (local_7e & 0xfc00) == 0xdc00)
           ) {
          iStack_78 = index + 2;
          uStack_7c = uStack_7c * 0x400 + (uint)local_7e + 0xfca02400;
        }
        if ((options & 0x200) == 0) {
          local_7f = (options & 0x400) != 0;
          iVar3 = iStack_78;
          while( true ) {
            iStack_78 = iVar3;
            if (local_7f == '\0') {
              UVar1 = icu_63::ustrcase_isLNS(uStack_7c);
              bVar4 = UVar1 == '\0';
            }
            else {
              iVar2 = ucase_getType_63(uStack_7c);
              bVar4 = iVar2 == 0;
            }
            if (!bVar4) break;
            c = iStack_78;
            if (iStack_78 == titleLimit) break;
            iVar3 = iStack_78 + 1;
            uStack_7c = (uint)*(ushort *)(csc._24_8_ + (long)iStack_78 * 2);
            if ((((uStack_7c & 0xfffffc00) == 0xd800) && (iVar3 != titleLimit)) &&
               (s._6_2_ = *(ushort *)(csc._24_8_ + (long)iVar3 * 2), (s._6_2_ & 0xfc00) == 0xdc00))
            {
              uStack_7c = uStack_7c * 0x400 + (uint)s._6_2_ + 0xfca02400;
              iVar3 = iStack_78 + 2;
            }
          }
          if ((index < c) &&
             (iStack_64 = icu_63::anon_unknown_10::appendUnchanged
                                    (dest,iStack_64,destCapacity,
                                     (UChar *)(csc._24_8_ + (long)index * 2),c - index,options,edits
                                    ), iStack_64 < 0)) {
            *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
          }
        }
        if (c < iStack_78) {
          csc.index = c;
          csc.limit = iStack_78;
          uStack_7c = ucase_toFullTitle_63
                                (uStack_7c,icu_63::anon_unknown_10::utf16_caseContextIterator,&prev,
                                 &local_90,caseLocale);
          iStack_64 = icu_63::anon_unknown_10::appendResult
                                (dest,iStack_64,destCapacity,uStack_7c,local_90,iStack_78 - c,
                                 options,edits);
          if (iStack_64 < 0) {
            *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
          }
          if (((c + 1 < titleLimit) && (caseLocale == 5)) &&
             ((*(short *)(csc._24_8_ + (long)c * 2) == 0x49 ||
              (*(short *)(csc._24_8_ + (long)c * 2) == 0x69)))) {
            if (*(short *)(csc._24_8_ + (long)(c + 1) * 2) == 0x6a) {
              iStack_64 = icu_63::anon_unknown_10::appendUChar(dest,iStack_64,destCapacity,L'J');
              if (iStack_64 < 0) {
                *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
                return 0;
              }
              if (edits != (Edits *)0x0) {
                icu_63::Edits::addReplace(edits,1,1);
              }
              iStack_78 = iStack_78 + 1;
            }
            else if (*(short *)(csc._24_8_ + (long)(c + 1) * 2) == 0x4a) {
              iStack_64 = icu_63::anon_unknown_10::appendUnchanged
                                    (dest,iStack_64,destCapacity,
                                     (UChar *)(csc._24_8_ + (long)c * 2 + 2),1,options,edits);
              if (iStack_64 < 0) {
                *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
                return 0;
              }
              iStack_78 = iStack_78 + 1;
            }
          }
          if (iStack_78 < titleLimit) {
            if ((options & 0x100) == 0) {
              iVar2 = icu_63::anon_unknown_10::toLower
                                (caseLocale,options,dest + iStack_64,destCapacity - iStack_64,
                                 (UChar *)csc._24_8_,(UCaseContext *)&prev,iStack_78,titleLimit,
                                 edits,errorCode);
              iStack_64 = iVar2 + iStack_64;
              if (*errorCode == U_BUFFER_OVERFLOW_ERROR) {
                *errorCode = U_ZERO_ERROR;
              }
              UVar1 = U_FAILURE(*errorCode);
              if (UVar1 != '\0') {
                return iStack_64;
              }
            }
            else {
              iStack_64 = icu_63::anon_unknown_10::appendUnchanged
                                    (dest,iStack_64,destCapacity,
                                     (UChar *)(csc._24_8_ + (long)iStack_78 * 2),
                                     titleLimit - iStack_78,options,edits);
              if (iStack_64 < 0) {
                *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
                return 0;
              }
            }
          }
        }
      }
      index = titleLimit;
    }
    options_local =
         icu_63::anon_unknown_10::checkOverflowAndEditsError(iStack_64,destCapacity,edits,errorCode)
    ;
  }
  return options_local;
}

Assistant:

U_CFUNC int32_t U_CALLCONV
ustrcase_internalToTitle(int32_t caseLocale, uint32_t options, BreakIterator *iter,
                         UChar *dest, int32_t destCapacity,
                         const UChar *src, int32_t srcLength,
                         icu::Edits *edits,
                         UErrorCode &errorCode) {
    if (!ustrcase_checkTitleAdjustmentOptions(options, errorCode)) {
        return 0;
    }

    /* set up local variables */
    UCaseContext csc=UCASECONTEXT_INITIALIZER;
    csc.p=(void *)src;
    csc.limit=srcLength;
    int32_t destIndex=0;
    int32_t prev=0;
    UBool isFirstIndex=TRUE;

    /* titlecasing loop */
    while(prev<srcLength) {
        /* find next index where to titlecase */
        int32_t index;
        if(isFirstIndex) {
            isFirstIndex=FALSE;
            index=iter->first();
        } else {
            index=iter->next();
        }
        if(index==UBRK_DONE || index>srcLength) {
            index=srcLength;
        }

        /*
         * Segment [prev..index[ into 3 parts:
         * a) skipped characters (copy as-is) [prev..titleStart[
         * b) first letter (titlecase)              [titleStart..titleLimit[
         * c) subsequent characters (lowercase)                 [titleLimit..index[
         */
        if(prev<index) {
            // Find and copy skipped characters [prev..titleStart[
            int32_t titleStart=prev;
            int32_t titleLimit=prev;
            UChar32 c;
            U16_NEXT(src, titleLimit, index, c);
            if ((options&U_TITLECASE_NO_BREAK_ADJUSTMENT)==0) {
                // Adjust the titlecasing index to the next cased character,
                // or to the next letter/number/symbol/private use.
                // Stop with titleStart<titleLimit<=index
                // if there is a character to be titlecased,
                // or else stop with titleStart==titleLimit==index.
                UBool toCased = (options&U_TITLECASE_ADJUST_TO_CASED) != 0;
                while (toCased ? UCASE_NONE==ucase_getType(c) : !ustrcase_isLNS(c)) {
                    titleStart=titleLimit;
                    if(titleLimit==index) {
                        break;
                    }
                    U16_NEXT(src, titleLimit, index, c);
                }
                if (prev < titleStart) {
                    destIndex=appendUnchanged(dest, destIndex, destCapacity,
                                              src+prev, titleStart-prev, options, edits);
                    if(destIndex<0) {
                        errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                        return 0;
                    }
                }
            }

            if(titleStart<titleLimit) {
                /* titlecase c which is from [titleStart..titleLimit[ */
                csc.cpStart=titleStart;
                csc.cpLimit=titleLimit;
                const UChar *s;
                c=ucase_toFullTitle(c, utf16_caseContextIterator, &csc, &s, caseLocale);
                destIndex=appendResult(dest, destIndex, destCapacity, c, s,
                                       titleLimit-titleStart, options, edits);
                if(destIndex<0) {
                    errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                    return 0;
                }

                /* Special case Dutch IJ titlecasing */
                if (titleStart+1 < index &&
                        caseLocale == UCASE_LOC_DUTCH &&
                        (src[titleStart] == 0x0049 || src[titleStart] == 0x0069)) {
                    if (src[titleStart+1] == 0x006A) {
                        destIndex=appendUChar(dest, destIndex, destCapacity, 0x004A);
                        if(destIndex<0) {
                            errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                            return 0;
                        }
                        if(edits!=NULL) {
                            edits->addReplace(1, 1);
                        }
                        titleLimit++;
                    } else if (src[titleStart+1] == 0x004A) {
                        // Keep the capital J from getting lowercased.
                        destIndex=appendUnchanged(dest, destIndex, destCapacity,
                                                  src+titleStart+1, 1, options, edits);
                        if(destIndex<0) {
                            errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                            return 0;
                        }
                        titleLimit++;
                    }
                }

                /* lowercase [titleLimit..index[ */
                if(titleLimit<index) {
                    if((options&U_TITLECASE_NO_LOWERCASE)==0) {
                        /* Normal operation: Lowercase the rest of the word. */
                        destIndex+=
                            toLower(
                                caseLocale, options,
                                dest+destIndex, destCapacity-destIndex,
                                src, &csc, titleLimit, index,
                                edits, errorCode);
                        if(errorCode==U_BUFFER_OVERFLOW_ERROR) {
                            errorCode=U_ZERO_ERROR;
                        }
                        if(U_FAILURE(errorCode)) {
                            return destIndex;
                        }
                    } else {
                        /* Optionally just copy the rest of the word unchanged. */
                        destIndex=appendUnchanged(dest, destIndex, destCapacity,
                                                  src+titleLimit, index-titleLimit, options, edits);
                        if(destIndex<0) {
                            errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                            return 0;
                        }
                    }
                }
            }
        }

        prev=index;
    }

    return checkOverflowAndEditsError(destIndex, destCapacity, edits, errorCode);
}